

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall
cppcms::application::add(application *this,application *app,string *name,string *url)

{
  application *paVar1;
  ulong in_R8;
  void *in_R9;
  
  if (app->parent_ != this) {
    app->parent_ = this;
    paVar1 = this->root_;
    if (paVar1 != paVar1->root_) {
      do {
        paVar1 = paVar1->root_;
        this->root_ = paVar1;
      } while (paVar1->root_ != paVar1);
    }
    app->root_ = paVar1;
  }
  url_mapper::mount((((this->d).ptr_)->url_map).ptr_,(char *)name,(char *)url,(char *)app,in_R8,
                    in_R9);
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url)
{
	add(app);
	mapper().mount(name,url,app);
}